

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_util_lite.cc
# Opt level: O3

void google::protobuf::TestUtilLite::SetAllFields(TestAllTypesLite *message)

{
  byte *pbVar1;
  RepeatedField<int> *this;
  RepeatedField<long> *this_00;
  RepeatedField<unsigned_int> *this_01;
  RepeatedField<unsigned_long> *this_02;
  RepeatedField<int> *this_03;
  RepeatedField<long> *this_04;
  RepeatedField<unsigned_int> *this_05;
  RepeatedField<unsigned_long> *this_06;
  RepeatedField<int> *this_07;
  RepeatedField<long> *this_08;
  RepeatedField<float> *this_09;
  RepeatedField<double> *this_10;
  RepeatedField<bool> *this_11;
  RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *dest;
  undefined1 *puVar2;
  RepeatedPtrField<proto2_unittest::TestAllTypesLite_RepeatedGroup> *this_12;
  RepeatedPtrField<proto2_unittest::TestAllTypesLite_NestedMessage> *this_13;
  RepeatedPtrField<proto2_unittest::ForeignMessageLite> *this_14;
  RepeatedPtrField<proto2_unittest_import::ImportMessageLite> *this_15;
  RepeatedPtrField<proto2_unittest::TestAllTypesLite_NestedMessage> *this_16;
  RepeatedField<int> *this_17;
  RepeatedField<int> *this_18;
  RepeatedField<int> *this_19;
  OneofFieldUnion *this_20;
  bool bVar3;
  TestAllTypesLite_OptionalGroup *pTVar4;
  TestAllTypesLite_NestedMessage *pTVar5;
  ForeignMessageLite *pFVar6;
  ImportMessageLite *pIVar7;
  PublicImportMessageLite *pPVar8;
  void *pvVar9;
  Arena *pAVar10;
  string_view value;
  string_view value_00;
  string_view value_01;
  string_view value_02;
  string_view value_03;
  string_view value_04;
  
  *(undefined8 *)((long)&message->field_0 + 0x248) = 0x6700000065;
  (message->field_0)._impl_.optional_int64_ = 0x66;
  (message->field_0)._impl_.optional_uint64_ = 0x68;
  *(undefined8 *)((long)&message->field_0 + 0x260) = 0x6b00000069;
  (message->field_0)._impl_.optional_sint64_ = 0x6a;
  (message->field_0)._impl_.optional_fixed64_ = 0x6c;
  *(undefined8 *)((long)&message->field_0 + 0x278) = 0x42de00000000006d;
  (message->field_0)._impl_.optional_sfixed64_ = 0x6e;
  (message->field_0)._impl_.optional_double_ = 112.0;
  (message->field_0)._impl_.optional_bool_ = true;
  (message->field_0)._impl_._has_bits_.has_bits_[0] =
       (message->field_0)._impl_._has_bits_.has_bits_[0] | 0xfff801;
  pAVar10 = (Arena *)(message->super_MessageLite)._internal_metadata_.ptr_;
  if (((ulong)pAVar10 & 1) != 0) {
    pAVar10 = *(Arena **)((ulong)pAVar10 & 0xfffffffffffffffe);
  }
  value._M_str = "115";
  value._M_len = 3;
  internal::ArenaStringPtr::Set(&(message->field_0)._impl_.optional_string_,value,pAVar10);
  *(byte *)&message->field_0 = *(byte *)&message->field_0 | 2;
  pAVar10 = (Arena *)(message->super_MessageLite)._internal_metadata_.ptr_;
  if (((ulong)pAVar10 & 1) != 0) {
    pAVar10 = *(Arena **)((ulong)pAVar10 & 0xfffffffffffffffe);
  }
  value_00._M_str = "116";
  value_00._M_len = 3;
  internal::ArenaStringPtr::Set(&(message->field_0)._impl_.optional_bytes_,value_00,pAVar10);
  *(byte *)&message->field_0 = *(byte *)&message->field_0 | 0x10;
  pTVar4 = (message->field_0)._impl_.optionalgroup_;
  if (pTVar4 == (TestAllTypesLite_OptionalGroup *)0x0) {
    pAVar10 = (Arena *)(message->super_MessageLite)._internal_metadata_.ptr_;
    if (((ulong)pAVar10 & 1) != 0) {
      pAVar10 = *(Arena **)((ulong)pAVar10 & 0xfffffffffffffffe);
    }
    pTVar4 = (TestAllTypesLite_OptionalGroup *)
             Arena::DefaultConstruct<proto2_unittest::TestAllTypesLite_OptionalGroup>(pAVar10);
    (message->field_0)._impl_.optionalgroup_ = pTVar4;
  }
  (pTVar4->field_0)._impl_.a_ = 0x75;
  *(byte *)&pTVar4->field_0 = *(byte *)&pTVar4->field_0 | 1;
  *(byte *)&message->field_0 = *(byte *)&message->field_0 | 0x20;
  pTVar5 = (message->field_0)._impl_.optional_nested_message_;
  if (pTVar5 == (TestAllTypesLite_NestedMessage *)0x0) {
    pAVar10 = (Arena *)(message->super_MessageLite)._internal_metadata_.ptr_;
    if (((ulong)pAVar10 & 1) != 0) {
      pAVar10 = *(Arena **)((ulong)pAVar10 & 0xfffffffffffffffe);
    }
    pTVar5 = (TestAllTypesLite_NestedMessage *)
             Arena::DefaultConstruct<proto2_unittest::TestAllTypesLite_NestedMessage>(pAVar10);
    (message->field_0)._impl_.optional_nested_message_ = pTVar5;
  }
  (pTVar5->field_0)._impl_.bb_ = 0x76;
  *(byte *)&pTVar5->field_0 = *(byte *)&pTVar5->field_0 | 2;
  *(byte *)&message->field_0 = *(byte *)&message->field_0 | 0x40;
  pFVar6 = (message->field_0)._impl_.optional_foreign_message_;
  if (pFVar6 == (ForeignMessageLite *)0x0) {
    pAVar10 = (Arena *)(message->super_MessageLite)._internal_metadata_.ptr_;
    if (((ulong)pAVar10 & 1) != 0) {
      pAVar10 = *(Arena **)((ulong)pAVar10 & 0xfffffffffffffffe);
    }
    pFVar6 = (ForeignMessageLite *)
             Arena::DefaultConstruct<proto2_unittest::ForeignMessageLite>(pAVar10);
    (message->field_0)._impl_.optional_foreign_message_ = pFVar6;
  }
  (pFVar6->field_0)._impl_.c_ = 0x77;
  *(byte *)&pFVar6->field_0 = *(byte *)&pFVar6->field_0 | 1;
  *(byte *)&message->field_0 = *(byte *)&message->field_0 | 0x80;
  pIVar7 = (message->field_0)._impl_.optional_import_message_;
  if (pIVar7 == (ImportMessageLite *)0x0) {
    pAVar10 = (Arena *)(message->super_MessageLite)._internal_metadata_.ptr_;
    if (((ulong)pAVar10 & 1) != 0) {
      pAVar10 = *(Arena **)((ulong)pAVar10 & 0xfffffffffffffffe);
    }
    pIVar7 = (ImportMessageLite *)
             Arena::DefaultConstruct<proto2_unittest_import::ImportMessageLite>(pAVar10);
    (message->field_0)._impl_.optional_import_message_ = pIVar7;
  }
  (pIVar7->field_0)._impl_.d_ = 0x78;
  *(byte *)&pIVar7->field_0 = *(byte *)&pIVar7->field_0 | 1;
  pbVar1 = (byte *)((long)&message->field_0 + 1);
  *pbVar1 = *pbVar1 | 1;
  pPVar8 = (message->field_0)._impl_.optional_public_import_message_;
  if (pPVar8 == (PublicImportMessageLite *)0x0) {
    pAVar10 = (Arena *)(message->super_MessageLite)._internal_metadata_.ptr_;
    if (((ulong)pAVar10 & 1) != 0) {
      pAVar10 = *(Arena **)((ulong)pAVar10 & 0xfffffffffffffffe);
    }
    pPVar8 = (PublicImportMessageLite *)
             Arena::DefaultConstruct<proto2_unittest_import::PublicImportMessageLite>(pAVar10);
    (message->field_0)._impl_.optional_public_import_message_ = pPVar8;
  }
  (pPVar8->field_0)._impl_.e_ = 0x7e;
  *(byte *)&pPVar8->field_0 = *(byte *)&pPVar8->field_0 | 1;
  pbVar1 = (byte *)((long)&message->field_0 + 1);
  *pbVar1 = *pbVar1 | 2;
  pTVar5 = (message->field_0)._impl_.optional_lazy_message_;
  if (pTVar5 == (TestAllTypesLite_NestedMessage *)0x0) {
    pAVar10 = (Arena *)(message->super_MessageLite)._internal_metadata_.ptr_;
    if (((ulong)pAVar10 & 1) != 0) {
      pAVar10 = *(Arena **)((ulong)pAVar10 & 0xfffffffffffffffe);
    }
    pTVar5 = (TestAllTypesLite_NestedMessage *)
             Arena::DefaultConstruct<proto2_unittest::TestAllTypesLite_NestedMessage>(pAVar10);
    (message->field_0)._impl_.optional_lazy_message_ = pTVar5;
  }
  (pTVar5->field_0)._impl_.bb_ = 0x7f;
  *(byte *)&pTVar5->field_0 = *(byte *)&pTVar5->field_0 | 2;
  pbVar1 = (byte *)((long)&message->field_0 + 1);
  *pbVar1 = *pbVar1 | 4;
  pTVar5 = (message->field_0)._impl_.optional_unverified_lazy_message_;
  if (pTVar5 == (TestAllTypesLite_NestedMessage *)0x0) {
    pAVar10 = (Arena *)(message->super_MessageLite)._internal_metadata_.ptr_;
    if (((ulong)pAVar10 & 1) != 0) {
      pAVar10 = *(Arena **)((ulong)pAVar10 & 0xfffffffffffffffe);
    }
    pTVar5 = (TestAllTypesLite_NestedMessage *)
             Arena::DefaultConstruct<proto2_unittest::TestAllTypesLite_NestedMessage>(pAVar10);
    (message->field_0)._impl_.optional_unverified_lazy_message_ = pTVar5;
  }
  (pTVar5->field_0)._impl_.bb_ = 0x80;
  *(byte *)&pTVar5->field_0 = *(byte *)&pTVar5->field_0 | 2;
  bVar3 = internal::ValidateEnum
                    (3,(uint32_t *)&proto2_unittest::TestAllTypesLite_NestedEnum_internal_data_);
  if (!bVar3) {
    __assert_fail("::google::protobuf::internal::ValidateEnum( value, ::proto2_unittest::TestAllTypesLite_NestedEnum_internal_data_)"
                  ,
                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O3/google/protobuf/unittest_lite.pb.h"
                  ,0x2d78,
                  "void proto2_unittest::TestAllTypesLite::_internal_set_optional_nested_enum(::proto2_unittest::TestAllTypesLite_NestedEnum)"
                 );
  }
  (message->field_0)._impl_.optional_nested_enum_ = 3;
  pbVar1 = (byte *)((long)&message->field_0 + 3);
  *pbVar1 = *pbVar1 | 2;
  bVar3 = internal::ValidateEnum(6,(uint32_t *)&proto2_unittest::ForeignEnumLite_internal_data_);
  if (!bVar3) {
    __assert_fail("::google::protobuf::internal::ValidateEnum( value, ::proto2_unittest::ForeignEnumLite_internal_data_)"
                  ,
                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O3/google/protobuf/unittest_lite.pb.h"
                  ,0x2d97,
                  "void proto2_unittest::TestAllTypesLite::_internal_set_optional_foreign_enum(::proto2_unittest::ForeignEnumLite)"
                 );
  }
  (message->field_0)._impl_.optional_foreign_enum_ = 6;
  pbVar1 = (byte *)((long)&message->field_0 + 3);
  *pbVar1 = *pbVar1 | 4;
  bVar3 = internal::ValidateEnum
                    (9,(uint32_t *)&proto2_unittest_import::ImportEnumLite_internal_data_);
  if (!bVar3) {
    __assert_fail("::google::protobuf::internal::ValidateEnum( value, ::proto2_unittest_import::ImportEnumLite_internal_data_)"
                  ,
                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O3/google/protobuf/unittest_lite.pb.h"
                  ,0x2db6,
                  "void proto2_unittest::TestAllTypesLite::_internal_set_optional_import_enum(::proto2_unittest_import::ImportEnumLite)"
                 );
  }
  (message->field_0)._impl_.optional_import_enum_ = 9;
  pbVar1 = (byte *)((long)&message->field_0 + 3);
  *pbVar1 = *pbVar1 | 1;
  this = &(message->field_0)._impl_.repeated_int32_;
  RepeatedField<int>::Add(this,0xc9);
  this_00 = &(message->field_0)._impl_.repeated_int64_;
  RepeatedField<long>::Add(this_00,0xca);
  this_01 = &(message->field_0)._impl_.repeated_uint32_;
  RepeatedField<unsigned_int>::Add(this_01,0xcb);
  this_02 = &(message->field_0)._impl_.repeated_uint64_;
  RepeatedField<unsigned_long>::Add(this_02,0xcc);
  this_03 = &(message->field_0)._impl_.repeated_sint32_;
  RepeatedField<int>::Add(this_03,0xcd);
  this_04 = &(message->field_0)._impl_.repeated_sint64_;
  RepeatedField<long>::Add(this_04,0xce);
  this_05 = &(message->field_0)._impl_.repeated_fixed32_;
  RepeatedField<unsigned_int>::Add(this_05,0xcf);
  this_06 = &(message->field_0)._impl_.repeated_fixed64_;
  RepeatedField<unsigned_long>::Add(this_06,0xd0);
  this_07 = &(message->field_0)._impl_.repeated_sfixed32_;
  RepeatedField<int>::Add(this_07,0xd1);
  this_08 = &(message->field_0)._impl_.repeated_sfixed64_;
  RepeatedField<long>::Add(this_08,0xd2);
  this_09 = &(message->field_0)._impl_.repeated_float_;
  RepeatedField<float>::Add(this_09,211.0);
  this_10 = &(message->field_0)._impl_.repeated_double_;
  RepeatedField<double>::Add(this_10,212.0);
  this_11 = &(message->field_0)._impl_.repeated_bool_;
  RepeatedField<bool>::Add(this_11,true);
  dest = &(message->field_0)._impl_.repeated_string_;
  internal::AddToRepeatedPtrField<char_const(&)[4]>(dest,(char (*) [4])"215");
  puVar2 = (undefined1 *)((long)&message->field_0 + 0xf8);
  internal::AddToRepeatedPtrField<char_const(&)[4],google::protobuf::internal::BytesTag>
            (puVar2,"216");
  this_12 = &(message->field_0)._impl_.repeatedgroup_;
  pvVar9 = internal::RepeatedPtrFieldBase::AddMessageLite
                     (&this_12->super_RepeatedPtrFieldBase,
                      Arena::DefaultConstruct<proto2_unittest::TestAllTypesLite_RepeatedGroup>);
  *(undefined4 *)((long)pvVar9 + 0x18) = 0xd9;
  *(byte *)((long)pvVar9 + 0x10) = *(byte *)((long)pvVar9 + 0x10) | 1;
  this_13 = &(message->field_0)._impl_.repeated_nested_message_;
  pvVar9 = internal::RepeatedPtrFieldBase::AddMessageLite
                     (&this_13->super_RepeatedPtrFieldBase,
                      Arena::DefaultConstruct<proto2_unittest::TestAllTypesLite_NestedMessage>);
  *(undefined4 *)((long)pvVar9 + 0x38) = 0xda;
  *(byte *)((long)pvVar9 + 0x10) = *(byte *)((long)pvVar9 + 0x10) | 2;
  this_14 = &(message->field_0)._impl_.repeated_foreign_message_;
  pvVar9 = internal::RepeatedPtrFieldBase::AddMessageLite
                     (&this_14->super_RepeatedPtrFieldBase,
                      Arena::DefaultConstruct<proto2_unittest::ForeignMessageLite>);
  *(undefined4 *)((long)pvVar9 + 0x18) = 0xdb;
  *(byte *)((long)pvVar9 + 0x10) = *(byte *)((long)pvVar9 + 0x10) | 1;
  this_15 = &(message->field_0)._impl_.repeated_import_message_;
  pvVar9 = internal::RepeatedPtrFieldBase::AddMessageLite
                     (&this_15->super_RepeatedPtrFieldBase,
                      Arena::DefaultConstruct<proto2_unittest_import::ImportMessageLite>);
  *(undefined4 *)((long)pvVar9 + 0x18) = 0xdc;
  *(byte *)((long)pvVar9 + 0x10) = *(byte *)((long)pvVar9 + 0x10) | 1;
  this_16 = &(message->field_0)._impl_.repeated_lazy_message_;
  pvVar9 = internal::RepeatedPtrFieldBase::AddMessageLite
                     (&this_16->super_RepeatedPtrFieldBase,
                      Arena::DefaultConstruct<proto2_unittest::TestAllTypesLite_NestedMessage>);
  *(undefined4 *)((long)pvVar9 + 0x38) = 0xe3;
  *(byte *)((long)pvVar9 + 0x10) = *(byte *)((long)pvVar9 + 0x10) | 2;
  bVar3 = internal::ValidateEnum
                    (2,(uint32_t *)&proto2_unittest::TestAllTypesLite_NestedEnum_internal_data_);
  if (bVar3) {
    this_17 = &(message->field_0)._impl_.repeated_nested_enum_;
    RepeatedField<int>::Add(this_17,2);
    bVar3 = internal::ValidateEnum(5,(uint32_t *)&proto2_unittest::ForeignEnumLite_internal_data_);
    if (!bVar3) {
LAB_001961ff:
      __assert_fail("::google::protobuf::internal::ValidateEnum( value, ::proto2_unittest::ForeignEnumLite_internal_data_)"
                    ,
                    "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O3/google/protobuf/unittest_lite.pb.h"
                    ,0x3372,
                    "void proto2_unittest::TestAllTypesLite::add_repeated_foreign_enum(::proto2_unittest::ForeignEnumLite)"
                   );
    }
    this_18 = &(message->field_0)._impl_.repeated_foreign_enum_;
    RepeatedField<int>::Add(this_18,5);
    bVar3 = internal::ValidateEnum
                      (8,(uint32_t *)&proto2_unittest_import::ImportEnumLite_internal_data_);
    if (bVar3) {
      this_19 = &(message->field_0)._impl_.repeated_import_enum_;
      RepeatedField<int>::Add(this_19,8);
      RepeatedField<int>::Add(this,0x12d);
      RepeatedField<long>::Add(this_00,0x12e);
      RepeatedField<unsigned_int>::Add(this_01,0x12f);
      RepeatedField<unsigned_long>::Add(this_02,0x130);
      RepeatedField<int>::Add(this_03,0x131);
      RepeatedField<long>::Add(this_04,0x132);
      RepeatedField<unsigned_int>::Add(this_05,0x133);
      RepeatedField<unsigned_long>::Add(this_06,0x134);
      RepeatedField<int>::Add(this_07,0x135);
      RepeatedField<long>::Add(this_08,0x136);
      RepeatedField<float>::Add(this_09,311.0);
      RepeatedField<double>::Add(this_10,312.0);
      RepeatedField<bool>::Add(this_11,false);
      internal::AddToRepeatedPtrField<char_const(&)[4]>(dest,(char (*) [4])"315");
      internal::AddToRepeatedPtrField<char_const(&)[4],google::protobuf::internal::BytesTag>
                (puVar2,"316");
      pvVar9 = internal::RepeatedPtrFieldBase::AddMessageLite
                         (&this_12->super_RepeatedPtrFieldBase,
                          Arena::DefaultConstruct<proto2_unittest::TestAllTypesLite_RepeatedGroup>);
      *(undefined4 *)((long)pvVar9 + 0x18) = 0x13d;
      *(byte *)((long)pvVar9 + 0x10) = *(byte *)((long)pvVar9 + 0x10) | 1;
      pvVar9 = internal::RepeatedPtrFieldBase::AddMessageLite
                         (&this_13->super_RepeatedPtrFieldBase,
                          Arena::DefaultConstruct<proto2_unittest::TestAllTypesLite_NestedMessage>);
      *(undefined4 *)((long)pvVar9 + 0x38) = 0x13e;
      *(byte *)((long)pvVar9 + 0x10) = *(byte *)((long)pvVar9 + 0x10) | 2;
      pvVar9 = internal::RepeatedPtrFieldBase::AddMessageLite
                         (&this_14->super_RepeatedPtrFieldBase,
                          Arena::DefaultConstruct<proto2_unittest::ForeignMessageLite>);
      *(undefined4 *)((long)pvVar9 + 0x18) = 0x13f;
      *(byte *)((long)pvVar9 + 0x10) = *(byte *)((long)pvVar9 + 0x10) | 1;
      pvVar9 = internal::RepeatedPtrFieldBase::AddMessageLite
                         (&this_15->super_RepeatedPtrFieldBase,
                          Arena::DefaultConstruct<proto2_unittest_import::ImportMessageLite>);
      *(undefined4 *)((long)pvVar9 + 0x18) = 0x140;
      *(byte *)((long)pvVar9 + 0x10) = *(byte *)((long)pvVar9 + 0x10) | 1;
      pvVar9 = internal::RepeatedPtrFieldBase::AddMessageLite
                         (&this_16->super_RepeatedPtrFieldBase,
                          Arena::DefaultConstruct<proto2_unittest::TestAllTypesLite_NestedMessage>);
      *(undefined4 *)((long)pvVar9 + 0x38) = 0x147;
      *(byte *)((long)pvVar9 + 0x10) = *(byte *)((long)pvVar9 + 0x10) | 2;
      bVar3 = internal::ValidateEnum
                        (3,(uint32_t *)&proto2_unittest::TestAllTypesLite_NestedEnum_internal_data_)
      ;
      if (!bVar3) goto LAB_001961e0;
      RepeatedField<int>::Add(this_17,3);
      bVar3 = internal::ValidateEnum(6,(uint32_t *)&proto2_unittest::ForeignEnumLite_internal_data_)
      ;
      if (!bVar3) goto LAB_001961ff;
      RepeatedField<int>::Add(this_18,6);
      bVar3 = internal::ValidateEnum
                        (9,(uint32_t *)&proto2_unittest_import::ImportEnumLite_internal_data_);
      if (bVar3) {
        RepeatedField<int>::Add(this_19,9);
        *(undefined8 *)((long)&message->field_0 + 0x2d8) = 0x19300000191;
        (message->field_0)._impl_.default_int64_ = 0x192;
        (message->field_0)._impl_.default_uint64_ = 0x194;
        *(undefined8 *)((long)&message->field_0 + 0x2f0) = 0x19700000195;
        (message->field_0)._impl_.default_sint64_ = 0x196;
        (message->field_0)._impl_.default_fixed64_ = 0x198;
        *(undefined8 *)((long)&message->field_0 + 0x308) = 0x43cd800000000199;
        (message->field_0)._impl_.default_sfixed64_ = 0x19a;
        (message->field_0)._impl_.default_double_ = 412.0;
        (message->field_0)._impl_.default_bool_ = false;
        *(ulong *)(message->field_0)._impl_._has_bits_.has_bits_ =
             *(ulong *)(message->field_0)._impl_._has_bits_.has_bits_ | 0x3ffe08000000;
        pAVar10 = (Arena *)(message->super_MessageLite)._internal_metadata_.ptr_;
        if (((ulong)pAVar10 & 1) != 0) {
          pAVar10 = *(Arena **)((ulong)pAVar10 & 0xfffffffffffffffe);
        }
        value_01._M_str = "415";
        value_01._M_len = 3;
        internal::ArenaStringPtr::Set(&(message->field_0)._impl_.default_string_,value_01,pAVar10);
        pbVar1 = (byte *)((long)&message->field_0 + 3);
        *pbVar1 = *pbVar1 | 0x10;
        pAVar10 = (Arena *)(message->super_MessageLite)._internal_metadata_.ptr_;
        if (((ulong)pAVar10 & 1) != 0) {
          pAVar10 = *(Arena **)((ulong)pAVar10 & 0xfffffffffffffffe);
        }
        value_02._M_str = "416";
        value_02._M_len = 3;
        internal::ArenaStringPtr::Set(&(message->field_0)._impl_.default_bytes_,value_02,pAVar10);
        bVar3 = internal::ValidateEnum
                          (1,(uint32_t *)
                             &proto2_unittest::TestAllTypesLite_NestedEnum_internal_data_);
        if (!bVar3) {
          __assert_fail("::google::protobuf::internal::ValidateEnum( value, ::proto2_unittest::TestAllTypesLite_NestedEnum_internal_data_)"
                        ,
                        "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O3/google/protobuf/unittest_lite.pb.h"
                        ,0x367c,
                        "void proto2_unittest::TestAllTypesLite::_internal_set_default_nested_enum(::proto2_unittest::TestAllTypesLite_NestedEnum)"
                       );
        }
        (message->field_0)._impl_.default_nested_enum_ = 1;
        pbVar1 = (byte *)((long)&message->field_0 + 5);
        *pbVar1 = *pbVar1 | 0x40;
        bVar3 = internal::ValidateEnum
                          (4,(uint32_t *)&proto2_unittest::ForeignEnumLite_internal_data_);
        if (!bVar3) {
          __assert_fail("::google::protobuf::internal::ValidateEnum( value, ::proto2_unittest::ForeignEnumLite_internal_data_)"
                        ,
                        "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O3/google/protobuf/unittest_lite.pb.h"
                        ,0x369b,
                        "void proto2_unittest::TestAllTypesLite::_internal_set_default_foreign_enum(::proto2_unittest::ForeignEnumLite)"
                       );
        }
        (message->field_0)._impl_.default_foreign_enum_ = 4;
        pbVar1 = (byte *)((long)&message->field_0 + 5);
        *pbVar1 = *pbVar1 | 0x80;
        bVar3 = internal::ValidateEnum
                          (7,(uint32_t *)&proto2_unittest_import::ImportEnumLite_internal_data_);
        if (bVar3) {
          (message->field_0)._impl_.default_import_enum_ = 7;
          pbVar1 = (byte *)((long)&message->field_0 + 6);
          *pbVar1 = *pbVar1 | 1;
          if ((message->field_0)._impl_._oneof_case_[0] != 0x6f) {
            proto2_unittest::TestAllTypesLite::clear_oneof_field(message);
            (message->field_0)._impl_._oneof_case_[0] = 0x6f;
          }
          *(undefined4 *)((long)&message->field_0 + 0x328) = 0x259;
          proto2_unittest::TestAllTypesLite::clear_oneof_field(message);
          (message->field_0)._impl_._oneof_case_[0] = 0x70;
          pAVar10 = (Arena *)(message->super_MessageLite)._internal_metadata_.ptr_;
          if (((ulong)pAVar10 & 1) != 0) {
            pAVar10 = *(Arena **)((ulong)pAVar10 & 0xfffffffffffffffe);
          }
          pvVar9 = Arena::DefaultConstruct<proto2_unittest::TestAllTypesLite_NestedMessage>(pAVar10)
          ;
          *(void **)((long)&message->field_0 + 0x328) = pvVar9;
          *(undefined4 *)((long)pvVar9 + 0x38) = 0x25a;
          *(byte *)((long)pvVar9 + 0x10) = *(byte *)((long)pvVar9 + 0x10) | 2;
          if ((message->field_0)._impl_._oneof_case_[0] != 0x71) {
            proto2_unittest::TestAllTypesLite::clear_oneof_field(message);
            (message->field_0)._impl_._oneof_case_[0] = 0x71;
            (message->field_0)._impl_.oneof_field_.oneof_nested_message_ =
                 (MessageLite *)&internal::fixed_address_empty_string;
          }
          this_20 = &(message->field_0)._impl_.oneof_field_;
          pAVar10 = (Arena *)(message->super_MessageLite)._internal_metadata_.ptr_;
          if (((ulong)pAVar10 & 1) != 0) {
            pAVar10 = *(Arena **)((ulong)pAVar10 & 0xfffffffffffffffe);
          }
          value_03._M_str = "603";
          value_03._M_len = 3;
          internal::ArenaStringPtr::Set(&this_20->oneof_string_,value_03,pAVar10);
          if ((message->field_0)._impl_._oneof_case_[0] != 0x72) {
            proto2_unittest::TestAllTypesLite::clear_oneof_field(message);
            (message->field_0)._impl_._oneof_case_[0] = 0x72;
            (message->field_0)._impl_.oneof_field_.oneof_nested_message_ =
                 (MessageLite *)&internal::fixed_address_empty_string;
          }
          pAVar10 = (Arena *)(message->super_MessageLite)._internal_metadata_.ptr_;
          if (((ulong)pAVar10 & 1) != 0) {
            pAVar10 = *(Arena **)((ulong)pAVar10 & 0xfffffffffffffffe);
          }
          value_04._M_str = "604";
          value_04._M_len = 3;
          internal::ArenaStringPtr::Set(&this_20->oneof_string_,value_04,pAVar10);
          return;
        }
        __assert_fail("::google::protobuf::internal::ValidateEnum( value, ::proto2_unittest_import::ImportEnumLite_internal_data_)"
                      ,
                      "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O3/google/protobuf/unittest_lite.pb.h"
                      ,0x36ba,
                      "void proto2_unittest::TestAllTypesLite::_internal_set_default_import_enum(::proto2_unittest_import::ImportEnumLite)"
                     );
      }
    }
    __assert_fail("::google::protobuf::internal::ValidateEnum( value, ::proto2_unittest_import::ImportEnumLite_internal_data_)"
                  ,
                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O3/google/protobuf/unittest_lite.pb.h"
                  ,0x33a6,
                  "void proto2_unittest::TestAllTypesLite::add_repeated_import_enum(::proto2_unittest_import::ImportEnumLite)"
                 );
  }
LAB_001961e0:
  __assert_fail("::google::protobuf::internal::ValidateEnum( value, ::proto2_unittest::TestAllTypesLite_NestedEnum_internal_data_)"
                ,
                "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O3/google/protobuf/unittest_lite.pb.h"
                ,0x333e,
                "void proto2_unittest::TestAllTypesLite::add_repeated_nested_enum(::proto2_unittest::TestAllTypesLite_NestedEnum)"
               );
}

Assistant:

void TestUtilLite::SetAllFields(unittest::TestAllTypesLite* message) {
  message->set_optional_int32(101);
  message->set_optional_int64(102);
  message->set_optional_uint32(103);
  message->set_optional_uint64(104);
  message->set_optional_sint32(105);
  message->set_optional_sint64(106);
  message->set_optional_fixed32(107);
  message->set_optional_fixed64(108);
  message->set_optional_sfixed32(109);
  message->set_optional_sfixed64(110);
  message->set_optional_float(111);
  message->set_optional_double(112);
  message->set_optional_bool(true);
  message->set_optional_string("115");
  message->set_optional_bytes("116");

  message->mutable_optionalgroup()->set_a(117);
  message->mutable_optional_nested_message()->set_bb(118);
  message->mutable_optional_foreign_message()->set_c(119);
  message->mutable_optional_import_message()->set_d(120);
  message->mutable_optional_public_import_message()->set_e(126);
  message->mutable_optional_lazy_message()->set_bb(127);
  message->mutable_optional_unverified_lazy_message()->set_bb(128);

  message->set_optional_nested_enum(unittest::TestAllTypesLite::BAZ);
  message->set_optional_foreign_enum(unittest::FOREIGN_LITE_BAZ);
  message->set_optional_import_enum(unittest_import::IMPORT_LITE_BAZ);


  // -----------------------------------------------------------------

  message->add_repeated_int32(201);
  message->add_repeated_int64(202);
  message->add_repeated_uint32(203);
  message->add_repeated_uint64(204);
  message->add_repeated_sint32(205);
  message->add_repeated_sint64(206);
  message->add_repeated_fixed32(207);
  message->add_repeated_fixed64(208);
  message->add_repeated_sfixed32(209);
  message->add_repeated_sfixed64(210);
  message->add_repeated_float(211);
  message->add_repeated_double(212);
  message->add_repeated_bool(true);
  message->add_repeated_string("215");
  message->add_repeated_bytes("216");

  message->add_repeatedgroup()->set_a(217);
  message->add_repeated_nested_message()->set_bb(218);
  message->add_repeated_foreign_message()->set_c(219);
  message->add_repeated_import_message()->set_d(220);
  message->add_repeated_lazy_message()->set_bb(227);

  message->add_repeated_nested_enum(unittest::TestAllTypesLite::BAR);
  message->add_repeated_foreign_enum(unittest::FOREIGN_LITE_BAR);
  message->add_repeated_import_enum(unittest_import::IMPORT_LITE_BAR);


  // Add a second one of each field.
  message->add_repeated_int32(301);
  message->add_repeated_int64(302);
  message->add_repeated_uint32(303);
  message->add_repeated_uint64(304);
  message->add_repeated_sint32(305);
  message->add_repeated_sint64(306);
  message->add_repeated_fixed32(307);
  message->add_repeated_fixed64(308);
  message->add_repeated_sfixed32(309);
  message->add_repeated_sfixed64(310);
  message->add_repeated_float(311);
  message->add_repeated_double(312);
  message->add_repeated_bool(false);
  message->add_repeated_string("315");
  message->add_repeated_bytes("316");

  message->add_repeatedgroup()->set_a(317);
  message->add_repeated_nested_message()->set_bb(318);
  message->add_repeated_foreign_message()->set_c(319);
  message->add_repeated_import_message()->set_d(320);
  message->add_repeated_lazy_message()->set_bb(327);

  message->add_repeated_nested_enum(unittest::TestAllTypesLite::BAZ);
  message->add_repeated_foreign_enum(unittest::FOREIGN_LITE_BAZ);
  message->add_repeated_import_enum(unittest_import::IMPORT_LITE_BAZ);


  // -----------------------------------------------------------------

  message->set_default_int32(401);
  message->set_default_int64(402);
  message->set_default_uint32(403);
  message->set_default_uint64(404);
  message->set_default_sint32(405);
  message->set_default_sint64(406);
  message->set_default_fixed32(407);
  message->set_default_fixed64(408);
  message->set_default_sfixed32(409);
  message->set_default_sfixed64(410);
  message->set_default_float(411);
  message->set_default_double(412);
  message->set_default_bool(false);
  message->set_default_string("415");
  message->set_default_bytes("416");

  message->set_default_nested_enum(unittest::TestAllTypesLite::FOO);
  message->set_default_foreign_enum(unittest::FOREIGN_LITE_FOO);
  message->set_default_import_enum(unittest_import::IMPORT_LITE_FOO);


  message->set_oneof_uint32(601);
  message->mutable_oneof_nested_message()->set_bb(602);
  message->set_oneof_string("603");
  message->set_oneof_bytes("604");
}